

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O1

bool __thiscall
LinearSystem::PerformOperation
          (LinearSystem *this,OperationType operation_type,int lhs,int rhs,Fraction coefficient)

{
  pointer *ppOVar1;
  pointer pOVar2;
  iterator __position;
  bool bVar3;
  Operation operation;
  Operation local_24;
  
  if (operation_type == MainOutput) {
    pOVar2 = (this->history_).
             super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((this->history_).
         super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
         _M_impl.super__Vector_impl_data._M_start == pOVar2) ||
       (pOVar2[-1].operation_type == MainOutput)) {
      bVar3 = false;
    }
    else {
      std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::emplace_back<>
                (&this->history_);
      bVar3 = true;
    }
  }
  else {
    local_24.coefficient.numerator_ = coefficient.numerator_;
    local_24.coefficient.denominator_ = coefficient.denominator_;
    local_24.operation_type = operation_type;
    local_24.lhs = lhs;
    local_24.rhs = rhs;
    bVar3 = ApplyOperation(this,operation_type,lhs,rhs,coefficient);
    if (bVar3) {
      __position._M_current =
           (this->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->history_).
          super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<LinearSystem::Operation,std::allocator<LinearSystem::Operation>>::
        _M_realloc_insert<LinearSystem::Operation_const&>
                  ((vector<LinearSystem::Operation,std::allocator<LinearSystem::Operation>> *)
                   &this->history_,__position,&local_24);
      }
      else {
        ((__position._M_current)->coefficient).denominator_ = local_24.coefficient.denominator_;
        (__position._M_current)->operation_type = local_24.operation_type;
        (__position._M_current)->lhs = local_24.lhs;
        (__position._M_current)->rhs = local_24.rhs;
        ((__position._M_current)->coefficient).numerator_ = local_24.coefficient.numerator_;
        ppOVar1 = &(this->history_).
                   super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppOVar1 = *ppOVar1 + 1;
      }
    }
  }
  return bVar3;
}

Assistant:

bool LinearSystem::PerformOperation(LinearSystem::OperationType operation_type, int lhs,
                                    int rhs, Fraction coefficient) {
  if (operation_type == OperationType::MainOutput) {
    return AddMainOutput();
  }

  Operation operation(operation_type, lhs, rhs, coefficient);
  if (ApplyOperation(operation)) {
    history_.push_back(operation);
    return true;
  }

  return false;
}